

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_UploadToBlob
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *destinationFileName,uchar *source,
          size_t size)

{
  _Bool isSuccess;
  IOTHUB_CLIENT_RESULT IVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext_00;
  uchar *local_a8;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext;
  _Bool uploadSucceeded;
  LOGGER_LOG l_1;
  char *azureBlobSasUri;
  char *uploadCorrelationId;
  LOGGER_LOG l;
  size_t sStack_38;
  IOTHUB_CLIENT_RESULT result;
  size_t size_local;
  uchar *source_local;
  char *destinationFileName_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  sStack_38 = size;
  size_local = (size_t)source;
  source_local = (uchar *)destinationFileName;
  destinationFileName_local = (char *)iotHubClientHandle;
  if (((iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) ||
      (destinationFileName == (char *)0x0)) || ((source == (uchar *)0x0 && (size != 0)))) {
    uploadCorrelationId = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)uploadCorrelationId != (LOGGER_LOG)0x0) {
      if (source_local == (uchar *)0x0) {
        local_a8 = "NULL";
      }
      else {
        local_a8 = source_local;
      }
      (*(code *)uploadCorrelationId)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                 ,"IoTHubClientCore_LL_UploadToBlob",0xac2,1,
                 "invalid parameters iotHubClientHandle=%p, const char* destinationFileName=%s, const unsigned char* source=%p, size_t size=%lu"
                 ,destinationFileName_local,local_a8,size_local,sStack_38);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    IVar1 = IoTHubClient_LL_UploadToBlob_InitializeUpload
                      (iotHubClientHandle->uploadToBlobHandle,destinationFileName,&azureBlobSasUri,
                       (char **)&l_1);
    if (IVar1 == IOTHUB_CLIENT_OK) {
      uploadContext_00 =
           IoTHubClient_LL_UploadToBlob_CreateContext
                     (*(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE *)(destinationFileName_local + 0x198),
                      (char *)l_1);
      if (uploadContext_00 == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_UploadToBlob",0xad7,1,
                    "Failed creating upload to blob context");
        }
        isSuccess = false;
      }
      else {
        IVar1 = IoTHubClient_LL_UploadToBlob_PutBlock
                          (uploadContext_00,0,(uint8_t *)size_local,sStack_38);
        if (IVar1 == IOTHUB_CLIENT_OK) {
          IVar1 = IoTHubClient_LL_UploadToBlob_PutBlockList(uploadContext_00);
          if (IVar1 == IOTHUB_CLIENT_OK) {
            isSuccess = true;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_UploadToBlob",0xae3,1,
                        "Failed completing upload to blob.");
            }
            isSuccess = false;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_UploadToBlob",0xade,1,
                      "Failed uploading block to Azure Blob Storage");
          }
          isSuccess = false;
        }
        IoTHubClient_LL_UploadToBlob_DestroyContext(uploadContext_00);
      }
      IVar1 = IoTHubClient_LL_UploadToBlob_NotifyCompletion
                        (*(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE *)
                          (destinationFileName_local + 0x198),azureBlobSasUri,isSuccess,400,
                         (char *)0x0);
      if (IVar1 == IOTHUB_CLIENT_OK) {
        l._4_4_ = IOTHUB_CLIENT_ERROR;
        if (isSuccess != false) {
          l._4_4_ = IOTHUB_CLIENT_OK;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_UploadToBlob",0xaf2,1,"Failed completing upload to blob.")
          ;
        }
        l._4_4_ = IOTHUB_CLIENT_ERROR;
      }
      free(azureBlobSasUri);
      free(l_1);
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_UploadToBlob",0xacd,1,
                  "Failed initializing upload in IoT Hub");
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_UploadToBlob(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* destinationFileName, const unsigned char* source, size_t size)
{
    IOTHUB_CLIENT_RESULT result;
    if (
        (iotHubClientHandle == NULL) ||
        (destinationFileName == NULL) ||
        ((source == NULL) && (size >0))
        )
    {
        LogError("invalid parameters iotHubClientHandle=%p, const char* destinationFileName=%s, const unsigned char* source=%p, size_t size=%lu",
            iotHubClientHandle, MU_P_OR_NULL(destinationFileName), source, (unsigned long)size);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        char* uploadCorrelationId;
        char* azureBlobSasUri;

        if (IoTHubClient_LL_UploadToBlob_InitializeUpload(
                iotHubClientHandle->uploadToBlobHandle, destinationFileName, &uploadCorrelationId, &azureBlobSasUri) != IOTHUB_CLIENT_OK)
        {
            LogError("Failed initializing upload in IoT Hub");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            bool uploadSucceeded;
            IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext = IoTHubClient_LL_UploadToBlob_CreateContext(iotHubClientHandle->uploadToBlobHandle, azureBlobSasUri);

            if (uploadContext == NULL)
            {
                LogError("Failed creating upload to blob context");
                uploadSucceeded = false;
            }
            else
            {
                if (IoTHubClient_LL_UploadToBlob_PutBlock(uploadContext, 0, source, size) != IOTHUB_CLIENT_OK)
                {
                    LogError("Failed uploading block to Azure Blob Storage");
                    uploadSucceeded = false;
                }
                else if (IoTHubClient_LL_UploadToBlob_PutBlockList(uploadContext) != IOTHUB_CLIENT_OK)
                {
                    LogError("Failed completing upload to blob.");
                    uploadSucceeded = false;
                }
                else
                {
                    uploadSucceeded = true; 
                }

                IoTHubClient_LL_UploadToBlob_DestroyContext(uploadContext);
            }

            // TODO (ewertons): fix the http error status below.
            if (IoTHubClient_LL_UploadToBlob_NotifyCompletion(
                    iotHubClientHandle->uploadToBlobHandle, uploadCorrelationId, uploadSucceeded, 400, NULL) != IOTHUB_CLIENT_OK)
            {
                LogError("Failed completing upload to blob.");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = (uploadSucceeded ? IOTHUB_CLIENT_OK : IOTHUB_CLIENT_ERROR); 
            }

            free(uploadCorrelationId);
            free(azureBlobSasUri);
        }
    }

    return result;
}